

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

iter_type __thiscall
booster::locale::impl_icu::num_format<wchar_t>::do_real_put<long_double>
          (num_format<wchar_t> *this,iter_type out,ios_base *ios,char_type_conflict fill,
          longdouble val)

{
  char_type_conflict *pcVar1;
  undefined1 auVar2 [12];
  char_type_conflict cVar3;
  ios_info *this_00;
  uint64_t uVar4;
  uint uVar5;
  streambuf_type *psVar6;
  undefined8 in_R9;
  long lVar7;
  long lVar8;
  bool bVar9;
  undefined1 auVar10 [12];
  iter_type iVar11;
  size_t code_points;
  _func_int **local_88;
  base_formatter local_78;
  longdouble local_6c;
  double local_60;
  long local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  psVar6 = out._M_sbuf;
  uVar5 = out._8_4_;
  local_6c = val;
  this_00 = ios_info::get(ios);
  uVar4 = ios_info::display_flags(this_00);
  if (uVar4 == 0) {
    bVar9 = true;
    local_88 = (_func_int **)0x0;
  }
  else {
    formatter<wchar_t>::create((formatter<wchar_t> *)&local_78,ios,&this->loc_,&this->enc_);
    local_88 = local_78._vptr_base_formatter;
    local_78._vptr_base_formatter = (_func_int **)0x0;
    bVar9 = local_88 == (_func_int **)0x0;
  }
  if (bVar9) {
    auVar10 = std::num_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
              do_put(this,psVar6,uVar5 & 0xff,ios,fill,in_R9,local_6c);
  }
  else {
    local_60 = (double)local_6c;
    (**(code **)(*local_88 + 0x10))(local_60,&local_50,local_88,&local_58);
    lVar8 = *(long *)(ios + 0x10) - local_58;
    if (lVar8 == 0 || *(long *)(ios + 0x10) < local_58) {
      lVar8 = 0;
      lVar7 = 0;
    }
    else {
      lVar7 = 0;
      if ((*(uint *)(ios + 0x18) & 0xb0) != 0x20) {
        lVar7 = lVar8;
      }
      lVar8 = lVar8 - lVar7;
    }
    if (0 < lVar7) {
      lVar7 = lVar7 + 1;
      do {
        if ((uVar5 & 1) == 0) {
          pcVar1 = *(char_type_conflict **)(psVar6 + 0x28);
          if (pcVar1 < *(char_type_conflict **)(psVar6 + 0x30)) {
            *pcVar1 = fill;
            *(char_type_conflict **)(psVar6 + 0x28) = pcVar1 + 1;
            cVar3 = fill;
          }
          else {
            cVar3 = (**(code **)(*(long *)psVar6 + 0x68))(psVar6,fill);
          }
          uVar5 = uVar5 & 0xff;
          if (cVar3 == -1) {
            uVar5 = 1;
          }
        }
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    if ((0 < local_48) && ((uVar5 & 1) == 0)) {
      (**(code **)(*(long *)psVar6 + 0x60))(psVar6,local_50);
    }
    if (0 < lVar8) {
      lVar8 = lVar8 + 1;
      do {
        if ((uVar5 & 1) == 0) {
          pcVar1 = *(char_type_conflict **)(psVar6 + 0x28);
          if (pcVar1 < *(char_type_conflict **)(psVar6 + 0x30)) {
            *pcVar1 = fill;
            *(char_type_conflict **)(psVar6 + 0x28) = pcVar1 + 1;
            cVar3 = fill;
          }
          else {
            cVar3 = (**(code **)(*(long *)psVar6 + 0x68))(psVar6,fill);
          }
          uVar5 = uVar5 & 0xff;
          if (cVar3 == -1) {
            uVar5 = 1;
          }
        }
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
    }
    auVar2._8_4_ = uVar5;
    auVar2._0_8_ = psVar6;
    auVar10._8_4_ = uVar5;
    auVar10._0_8_ = psVar6;
    *(undefined8 *)(ios + 0x10) = 0;
    if (local_50 != local_40) {
      operator_delete(local_50);
      auVar10 = auVar2;
    }
  }
  if (local_88 != (_func_int **)0x0) {
    (**(code **)(*local_88 + 8))(local_88);
  }
  iVar11._12_4_ = 0;
  iVar11._M_sbuf = (streambuf_type *)auVar10._0_8_;
  iVar11._M_failed = (bool)auVar10[8];
  iVar11._9_3_ = auVar10._9_3_;
  return iVar11;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        formatter_ptr formatter;
        
        if(use_parent<ValueType>(ios,val) || (formatter = formatter_type::create(ios,loc_,enc_)).get() == 0) {
            return std::num_put<char_type>::do_put(out,ios,fill,val);
        }
        
        size_t code_points;
        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type const &str = formatter->format(static_cast<cast_type>(val),code_points);
        std::streamsize on_left=0,on_right = 0,points = code_points;
        if(points < ios.width()) {
            std::streamsize n = ios.width() - points;
            
            std::ios_base::fmtflags flags = ios.flags() & std::ios_base::adjustfield;
            
            //
            // We do not really know internal point, so we assume that it does not
            // exist. So according to the standard field should be right aligned
            //
            if(flags != std::ios_base::left)
                on_left = n;
            on_right = n - on_left;
        }
        while(on_left > 0) {
            *out++ = fill;
            on_left--;
        }
        std::copy(str.begin(),str.end(),out);
        while(on_right > 0) {
            *out++ = fill;
            on_right--;
        }
        ios.width(0);
        return out;

    }